

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O1

Env * evaluator::Evaluator::extendFunctionEnv
                (GCPtr<symbols::FunctionObject> *function,
                vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *args)

{
  pointer pcVar1;
  Env *this;
  pointer ppIVar2;
  long lVar3;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar4;
  string local_50;
  
  this = NewEnvironment(function->addr->env);
  ppIVar2 = (function->addr->parameters).
            super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(function->addr->parameters).
                              super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3)) {
    lVar3 = 0;
    do {
      pcVar1 = (ppIVar2[lVar3]->tok).Literal._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + (ppIVar2[lVar3]->tok).Literal._M_string_length)
      ;
      plVar4 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
      do {
        plVar4 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                 (plVar4->
                 super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (plVar4 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
      } while (*(_List_node_base **)((long)plVar4 + 0x10U + 8) !=
               (_List_node_base *)
               (args->
               super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>)
               ._M_impl.super__Vector_impl_data._M_start[lVar3].addr);
      std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::remove
                (&GCPtr<symbols::Object>::gclist_abi_cxx11_,(char *)((long)plVar4 + 0x10));
      symbols::Env::put(this,&local_50,(Object *)*(_List_node_base **)((long)plVar4 + 0x10U + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar3 = lVar3 + 1;
      ppIVar2 = (function->addr->parameters).
                super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar3 < (int)((ulong)((long)(function->addr->parameters).
                                         super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2)
                          >> 3));
  }
  return this;
}

Assistant:

Env* Evaluator::extendFunctionEnv(GCPtr<FunctionObject>& function, std::vector<GCPtr<Object>>& args){
    auto env = NewEnvironment(function->env);
    for(int paramIndex{0}; paramIndex < (int)function->parameters.size(); paramIndex++){
        env->put(function->parameters[paramIndex]->tok.Literal, args[paramIndex].unref());
    }
    return env;
}